

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

UnknownFieldSet * __thiscall
google::protobuf::internal::InternalMetadata::
mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(InternalMetadata *this)

{
  undefined8 *puVar1;
  Arena *this_00;
  
  this_00 = (Arena *)this->ptr_;
  if (((ulong)this_00 & 1) != 0) {
    this_00 = *(Arena **)((ulong)this_00 & 0xfffffffffffffffe);
  }
  if (this_00 == (Arena *)0x0) {
    puVar1 = (undefined8 *)operator_new(0x18);
    puVar1[1] = 0;
  }
  else {
    puVar1 = (undefined8 *)Arena::Allocate(this_00,0x18);
    ShortSooRep::ShortSooRep((ShortSooRep *)(puVar1 + 1),this_00);
  }
  this->ptr_ = (ulong)puVar1 | 1;
  *puVar1 = this_00;
  return (UnknownFieldSet *)(puVar1 + 1);
}

Assistant:

PROTOBUF_NOINLINE T* mutable_unknown_fields_slow() {
    Arena* my_arena = arena();
    Container<T>* container = Arena::Create<Container<T>>(my_arena);
    // Two-step assignment works around a bug in clang's static analyzer:
    // https://bugs.llvm.org/show_bug.cgi?id=34198.
    ptr_ = reinterpret_cast<intptr_t>(container);
    ptr_ |= kUnknownFieldsTagMask;
    container->arena = my_arena;
    return &(container->unknown_fields);
  }